

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O2

int mbhitm(monst *mtmp,obj *otmp)

{
  short sVar1;
  uint uVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  obj *poVar7;
  
  if ((mtmp != &youmonst) && (mtmp->field_0x62 = mtmp->field_0x62 & 0xf7, mtmp->m_ap_type != '\0'))
  {
    seemimic(mtmp);
  }
  sVar1 = otmp->otyp;
  if (sVar1 == 0x1a1) {
LAB_001edca5:
    cancel_monst(mtmp,otmp,'\0','\x01','\0');
    return 0;
  }
  if (sVar1 == 0x1cb) {
    if (mtmp == &youmonst) {
      if (zap_oseen != '\0') {
        discover_object(0x1cb,'\x01','\x01');
      }
      tele((char *)0x0);
      return 0;
    }
    if (((mtmp->field_0x63 & 0x10) != 0) &&
       (pcVar6 = in_rooms(level,mtmp->mx,mtmp->my,10), *pcVar6 != '\0')) {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
        pcVar6 = Monnam(mtmp);
        pline("%s resists the magic!",pcVar6);
      }
      mtmp->field_0x62 = mtmp->field_0x62 & 0xf7;
      if (mtmp->m_ap_type == '\0') {
        return 0;
      }
      seemimic(mtmp);
      return 0;
    }
    bVar3 = tele_restrict(mtmp);
    if (bVar3 != '\0') {
      return 0;
    }
    rloc(level,mtmp,'\0');
    return 0;
  }
  if (sVar1 == 0x1ca) goto LAB_001edca5;
  if (sVar1 != 0x1c4) {
    return 0;
  }
  if (mtmp == &youmonst) {
    if (zap_oseen != '\0') {
      discover_object(0x1c4,'\x01','\x01');
    }
    if ((u.uprops[0x2c].extrinsic == 0) &&
       ((u.umonnum == u.umonster || (bVar3 = resists_magm(&youmonst), bVar3 == '\0')))) {
      iVar5 = rnd(0x14);
      if (u.uac + 10 <= iVar5) {
        pcVar6 = "The wand misses you.";
        goto LAB_001eddd4;
      }
      pline("The wand hits you!");
      iVar5 = dice(2,0xc);
      if (u.uprops[0x32].extrinsic != 0 || u.uprops[0x32].intrinsic != 0) {
        iVar5 = (iVar5 + 1) / 2;
      }
      losehp(iVar5,"wand",0);
    }
    else {
      shieldeff(u.ux,u.uy);
      pcVar6 = "Boing!";
LAB_001eddd4:
      pline(pcVar6);
    }
    stop_occupation();
    nomul(0,(char *)0x0);
  }
  else {
    bVar3 = resists_magm(mtmp);
    if (bVar3 == '\0') {
      iVar5 = rnd(0x14);
      iVar4 = find_mac(mtmp);
      if (iVar5 < iVar4 + 10) {
        iVar5 = dice(2,0xc);
        pcVar6 = exclam(iVar5);
        hit("wand",'\0',mtmp,pcVar6);
        resist(mtmp,otmp->oclass,iVar5,1);
      }
      else {
        miss("wand",mtmp);
      }
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) && (zap_oseen != '\0')) {
        discover_object(0x1c4,'\x01','\x01');
      }
    }
    else {
      shieldeff(mtmp->mx,mtmp->my);
      pline("Boing!");
    }
  }
  if (mtmp->mhp < 1) {
    return 0;
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001ee00d;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001edfa6;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001edf9d;
    }
    else {
LAB_001edf9d:
      if (ublindf == (obj *)0x0) goto LAB_001ee060;
LAB_001edfa6:
      if (ublindf->oartifact != '\x1d') goto LAB_001ee060;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0))
       && ((mtmp->data->mflags3 & 0x200) != 0)) goto LAB_001ee00d;
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 != '\0') {
LAB_001ee00d:
      uVar2 = *(uint *)&mtmp->field_0x60;
      if ((((uVar2 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar2 & 0x280) == 0) goto LAB_001ee053;
      }
      else if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001ee053:
        if ((u._1052_1_ & 0x20) == 0) {
          return 0;
        }
      }
    }
  }
LAB_001ee060:
  if (((mtmp->data->mflags1 & 0x10000) != 0) ||
     ((poVar7 = which_armor(mtmp,4), poVar7 != (obj *)0x0 &&
      (poVar7 = which_armor(mtmp,4), poVar7->otyp == 0x4f)))) goto joined_r0x001ee197;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ee0b4;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ee0af;
  }
  else {
LAB_001ee0af:
    if (ublindf != (obj *)0x0) {
LAB_001ee0b4:
      if (ublindf->oartifact == '\x1d') goto LAB_001ee147;
    }
    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
      return 0;
    }
  }
LAB_001ee147:
  if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
     (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar5 < 0x41)) {
    return 0;
  }
joined_r0x001ee197:
  if (((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) &&
     (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')) {
    map_invisible(bhitpos.x,bhitpos.y);
  }
  return 0;
}

Assistant:

static int mbhitm(struct monst *mtmp, struct obj *otmp)
{
	int tmp;

	boolean reveal_invis = FALSE;
	if (mtmp != &youmonst) {
		mtmp->msleeping = 0;
		if (mtmp->m_ap_type) seemimic(mtmp);
	}
	switch(otmp->otyp) {
	case WAN_STRIKING:
		reveal_invis = TRUE;
		if (mtmp == &youmonst) {
			if (zap_oseen) makeknown(WAN_STRIKING);
			if (Antimagic) {
			    shieldeff(u.ux, u.uy);
			    pline("Boing!");
			} else if (rnd(20) < 10 + u.uac) {
			    pline("The wand hits you!");
			    tmp = dice(2,12);
			    if (Half_spell_damage) tmp = (tmp+1) / 2;
			    losehp(tmp, "wand", KILLED_BY_AN);
			} else pline("The wand misses you.");
			stop_occupation();
			nomul(0, NULL);
		} else if (resists_magm(mtmp)) {
			shieldeff(mtmp->mx, mtmp->my);
			pline("Boing!");
		} else if (rnd(20) < 10+find_mac(mtmp)) {
			tmp = dice(2,12);
			hit("wand", FALSE, mtmp, exclam(tmp));
			resist(mtmp, otmp->oclass, tmp, TELL);
			if (cansee(mtmp->mx, mtmp->my) && zap_oseen)
				makeknown(WAN_STRIKING);
		} else {
			miss("wand", mtmp);
			if (cansee(mtmp->mx, mtmp->my) && zap_oseen)
				makeknown(WAN_STRIKING);
		}
		break;
	case WAN_TELEPORTATION:
		if (mtmp == &youmonst) {
			if (zap_oseen) makeknown(WAN_TELEPORTATION);
			tele(NULL);
		} else {
			/* for consistency with zap.c, don't identify */
			if (mtmp->ispriest &&
				*in_rooms(level, mtmp->mx, mtmp->my, TEMPLE)) {
			    if (cansee(mtmp->mx, mtmp->my))
				pline("%s resists the magic!", Monnam(mtmp));
			    mtmp->msleeping = 0;
			    if (mtmp->m_ap_type) seemimic(mtmp);
			} else if (!tele_restrict(mtmp))
			    rloc(level, mtmp, FALSE);
		}
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_monst(mtmp, otmp, FALSE, TRUE, FALSE);
		break;
	}
	if (reveal_invis) {
	    if (mtmp->mhp > 0 && cansee(bhitpos.x,bhitpos.y)
							&& !canspotmon(level, mtmp))
		map_invisible(bhitpos.x, bhitpos.y);
	}
	return 0;
}